

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  int32_t iVar1;
  GCfunc *pGVar2;
  int local_3c;
  int32_t n;
  int i;
  GCRef *p [2];
  GCfunc *fn [2];
  lua_State *L_local;
  
  local_3c = 0;
  while( true ) {
    if (1 < local_3c) {
      *_n = p[0]->gcptr64;
      if (((*(byte *)(p[0]->gcptr64 + 8) & 3) != 0) && ((p[1][1].gcptr64 & 4) != 0)) {
        lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)p[1],(GCobj *)p[0]->gcptr64);
      }
      return 0;
    }
    pGVar2 = lj_lib_checkfunc(L,local_3c * 2 + 1);
    p[(long)local_3c + 1] = (GCRef *)pGVar2;
    if (*(undefined1 *)((long)&p[(long)local_3c + 1][1].gcptr64 + 2) != '\0') break;
    iVar1 = lj_lib_checkint(L,local_3c * 2 + 2);
    if ((uint)(byte)*(undefined1 *)((long)&p[(long)local_3c + 1][1].gcptr64 + 3) <= iVar1 - 1U) {
      lj_err_arg(L,local_3c * 2 + 2,LJ_ERR_IDXRNG);
    }
    *(GCRef **)(&n + (long)local_3c * 2) = p[(long)local_3c + 1] + (long)(int)(iVar1 - 1U) + 5;
    local_3c = local_3c + 1;
  }
  lj_err_arg(L,local_3c * 2 + 1,LJ_ERR_NOLFUNC);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}